

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

uint32_t CLI::detail::hexConvert(char hc)

{
  uint32_t uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,hc);
  if ((byte)(hc - 0x30U) < 10) {
    return iVar2 - 0x30;
  }
  if ((byte)(hc + 0xbfU) < 6) {
    return iVar2 - 0x37;
  }
  uVar1 = 0xffffffff;
  if ((byte)(hc + 0x9fU) < 6) {
    uVar1 = iVar2 - 0x57;
  }
  return uVar1;
}

Assistant:

CLI11_INLINE std::uint32_t hexConvert(char hc) {
    int hcode{0};
    if(hc >= '0' && hc <= '9') {
        hcode = (hc - '0');
    } else if(hc >= 'A' && hc <= 'F') {
        hcode = (hc - 'A' + 10);
    } else if(hc >= 'a' && hc <= 'f') {
        hcode = (hc - 'a' + 10);
    } else {
        hcode = -1;
    }
    return static_cast<uint32_t>(hcode);
}